

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall
leveldb::Block::Iter::Iter
          (Iter *this,Comparator *comparator,char *data,uint32_t restarts,uint32_t num_restarts)

{
  uint32_t num_restarts_local;
  uint32_t restarts_local;
  char *data_local;
  Comparator *comparator_local;
  Iter *this_local;
  
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__Iter_00165d40;
  this->comparator_ = comparator;
  this->data_ = data;
  this->restarts_ = restarts;
  this->num_restarts_ = num_restarts;
  this->current_ = this->restarts_;
  this->restart_index_ = this->num_restarts_;
  std::__cxx11::string::string((string *)&this->key_);
  Slice::Slice(&this->value_);
  Status::Status(&this->status_);
  if (this->num_restarts_ != 0) {
    return;
  }
  __assert_fail("num_restarts_ > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/block.cc"
                ,0x7b,
                "leveldb::Block::Iter::Iter(const Comparator *, const char *, uint32_t, uint32_t)");
}

Assistant:

Iter(const Comparator* comparator, const char* data, uint32_t restarts,
       uint32_t num_restarts)
      : comparator_(comparator),
        data_(data),
        restarts_(restarts),
        num_restarts_(num_restarts),
        current_(restarts_),
        restart_index_(num_restarts_) {
    assert(num_restarts_ > 0);
  }